

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void laguerre_ss_compute(int order,double *xtab,double *weight)

{
  double *b;
  double *c;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double local_70;
  double dp2;
  double p1;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double x;
  
  uVar5 = 0;
  uVar1 = 0xffffffffffffffff;
  if (-1 < order) {
    uVar1 = (ulong)(uint)order << 3;
  }
  uVar3 = 0;
  if (0 < order) {
    uVar3 = (ulong)(uint)order;
  }
  p1 = (double)weight;
  x._4_4_ = order;
  b = (double *)operator_new__(uVar1);
  c = (double *)operator_new__(uVar1);
  for (; (uint)((int)uVar3 * 2) != uVar5; uVar5 = uVar5 + 2) {
    *(double *)((long)b + uVar5 * 4) = (double)((int)uVar5 + 1);
  }
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    c[uVar1] = (double)((int)uVar1 * (int)uVar1);
  }
  local_58 = 1.0;
  for (lVar2 = 1; lVar2 < x._4_4_; lVar2 = lVar2 + 1) {
    local_58 = local_58 * c[lVar2];
  }
  local_50 = 15.0 / ((double)x._4_4_ * 2.5 + 1.0);
  dVar6 = (double)x._4_4_ * 2.4 + 1.0;
  local_48 = 3.0 / dVar6;
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    iVar4 = (int)uVar1;
    if (iVar4 == 1) {
      local_40 = dVar6 + local_50;
    }
    else {
      local_40 = local_48;
      if (iVar4 != 0) {
        local_40 = (dVar6 - xtab[uVar1 - 2]) *
                   (((double)(iVar4 + -1) * 2.55 + 1.0) / ((double)(iVar4 + -1) * 1.9)) + dVar6;
      }
    }
    laguerre_ss_root(&local_40,x._4_4_,&local_70,&dp2,b,c);
    xtab[uVar1] = local_40;
    *(double *)((long)p1 + uVar1 * 8) = (local_58 / local_70) / dp2;
    dVar6 = local_40;
  }
  operator_delete__(b);
  operator_delete__(c);
  return;
}

Assistant:

void laguerre_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_SS_COMPUTE computes a Gauss-Laguerre quadrature rule.
//
//  Discussion:
//
//    If the integral is:
//
//      Integral ( 0 <= X < +oo ) EXP ( - X ) * F(X) dX
//
//    then the quadrature rule is:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    If the integral is:
//
//      Integral ( A <= X < +oo ) F(X) dX
//
//    then the quadrature rule is:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * EXP(XTAB(I)) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the quadrature rule to be computed.
//    ORDER must be at least 1.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double *b;
  double *c;
  double cc;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double x;

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 0; i < order; i++ )
  {
    b[i] = double( 2 * i + 1 );
  }

  for ( i = 0; i < order; i++ )
  {
    c[i] = double( i * i );
  }
  prod = 1.0;
  for ( i = 1; i < order; i++ )
  {
    prod = prod * c[i];
  }
  cc = prod;

  for ( i = 0; i < order; i++ )
  {
//
//  Compute an estimate for the root.
//
    if ( i == 0 )
    {
      x =  3.0 / ( 1.0 + 2.4 * double( order ) );
    }
    else if ( i == 1 )
    {
      x = x + 15.0 / ( 1.0 + 2.5 * double( order ) );
    }
    else
    {
      r1 = ( 1.0 + 2.55 * double( i - 1 ) ) 
        / ( 1.9 * double( i - 1 ) );

      x = x + r1 * ( x - xtab[i-2] );
    }
//
//  Use iteration to find the root.
//
    laguerre_ss_root ( &x, order, &dp2, &p1, b, c );
//
//  Set the abscissa and weight.
//
    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;
  }

  delete [] b;
  delete [] c;

  return;
}